

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_tet_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  REF_INT cell;
  char *pcVar9;
  REF_INT ntri;
  REF_BOOL *local_c8;
  REF_NODE local_c0;
  ulong local_b8;
  REF_DBL quality;
  REF_INT nodes [27];
  
  local_c0 = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[8];
  local_b8 = 0xffffffff;
  cell = -1;
  local_c8 = allowed;
  if (-1 < node1) {
    pRVar1 = ref_cell->ref_adj;
    local_b8 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node1];
      local_b8 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        local_b8 = (ulong)uVar4;
      }
    }
  }
  do {
    if ((int)local_b8 == -1) {
      *local_c8 = 1;
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) {
      pcVar9 = "nodes";
      uVar8 = 0x34d;
      goto LAB_001ccb5b;
    }
    uVar4 = ref_cell->node_per;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    bVar3 = false;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[uVar5] == node0) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        if (nodes[lVar6] == node1) {
          nodes[lVar6] = node0;
        }
      }
      uVar4 = ref_node_tet_quality(local_c0,nodes,&quality);
      if (uVar4 != 0) {
        pcVar9 = "qual";
        uVar8 = 0x356;
LAB_001ccb5b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar8,"ref_collapse_edge_tet_quality",(ulong)uVar4,pcVar9);
        return uVar4;
      }
      if (quality < ref_grid->adapt->collapse_quality_absolute) {
        return 0;
      }
      uVar4 = ref_cell_ntri_with_tet_nodes(ref_grid->cell[3],nodes,&ntri);
      if (uVar4 != 0) {
        pcVar9 = "count boundary triangles";
        uVar8 = 0x35b;
        goto LAB_001ccb5b;
      }
      if (1 < ntri) {
        return 0;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    local_b8 = (ulong)pRVar2[(int)local_b8].next;
    cell = -1;
    if (local_b8 != 0xffffffffffffffff) {
      cell = pRVar2[local_b8].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tet_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, ntri;
  REF_DBL quality;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    RSS(ref_cell_ntri_with_tet_nodes(ref_grid_tri(ref_grid), nodes, &ntri),
        "count boundary triangles");
    if (ntri > 1) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}